

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

void __thiscall
TPZSparseBlockDiagonal<float>::BuildFromMatrix
          (TPZSparseBlockDiagonal<float> *this,TPZMatrix<float> *matrix)

{
  int iVar1;
  long lVar2;
  int64_t newsize;
  long lVar3;
  TPZFMatrix<float> *block;
  long *plVar4;
  long *in_RSI;
  TPZBlockDiagonal<float> *in_RDI;
  int64_t first;
  int64_t iel;
  int64_t nel;
  int64_t nbl;
  int64_t ibl;
  TPZFNMatrix<10000,_float> submat;
  TPZManVector<long,_10> indices;
  TPZManVector<long,_10> *in_stack_ffffffffffff6230;
  int64_t in_stack_ffffffffffff6240;
  int64_t in_stack_ffffffffffff6248;
  TPZFNMatrix<10000,_float> *in_stack_ffffffffffff6250;
  int64_t local_9d88;
  int64_t local_9d70;
  int64_t in_stack_ffffffffffff6298;
  int64_t in_stack_ffffffffffff62a0;
  TPZFMatrix<float> *in_stack_ffffffffffff62a8;
  TPZVec<long> local_80 [3];
  long *local_10;
  
  local_10 = in_RSI;
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)in_stack_ffffffffffff6250,in_stack_ffffffffffff6248);
  TPZFNMatrix<10000,_float>::TPZFNMatrix
            (in_stack_ffffffffffff6250,in_stack_ffffffffffff6248,in_stack_ffffffffffff6240);
  newsize = TPZVec<long>::NElements((TPZVec<long> *)&in_RDI[1].fStorage);
  lVar3 = newsize + -1;
  for (local_9d70 = 0; local_9d70 < lVar3; local_9d70 = local_9d70 + 1) {
    block = (TPZFMatrix<float> *)TPZVec<int>::operator[](&in_RDI->fBlockSize,local_9d70);
    iVar1 = *(int *)&(block->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable.
                     _vptr_TPZSavable;
    TPZManVector<long,_10>::Resize((TPZManVector<long,_10> *)in_RDI,newsize);
    TPZFMatrix<float>::Resize
              (in_stack_ffffffffffff62a8,in_stack_ffffffffffff62a0,in_stack_ffffffffffff6298);
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)&in_RDI[1].fStorage,local_9d70);
    lVar2 = *plVar4;
    for (local_9d88 = 0; local_9d88 < iVar1; local_9d88 = local_9d88 + 1) {
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 1),lVar2 + local_9d88);
      in_stack_ffffffffffff6230 = (TPZManVector<long,_10> *)*plVar4;
      plVar4 = TPZVec<long>::operator[](local_80,local_9d88);
      *plVar4 = (long)in_stack_ffffffffffff6230;
    }
    (**(code **)(*local_10 + 0x248))(local_10,local_80,&stack0xffffffffffff62a8);
    TPZBlockDiagonal<float>::SetBlock(in_RDI,newsize,block);
  }
  TPZFNMatrix<10000,_float>::~TPZFNMatrix((TPZFNMatrix<10000,_float> *)0x13a711b);
  TPZManVector<long,_10>::~TPZManVector(in_stack_ffffffffffff6230);
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::BuildFromMatrix(TPZMatrix<TVar>& matrix)
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "TPZSparseBlockDiagonal::BuildFromMatrix");
#endif
	TPZManVector<int64_t> indices;
	TPZFNMatrix<10000,TVar> submat(0,0);
	int64_t ibl,nbl = fBlockIndex.NElements()-1;
	for(ibl=0; ibl<nbl; ibl++)
	{
		int64_t nel = this->fBlockSize[ibl];
		indices.Resize(nel);
		submat.Resize(nel,nel);
		int64_t iel,first = fBlockIndex[ibl];
		for(iel=0; iel<nel; iel++) indices[iel] = fBlock[first+iel];
		matrix.GetSub(indices,submat);
		this->SetBlock(ibl,submat);
	}
}